

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

uint Extra_TruthPolarize(uint uTruth,int Polarity,int nVars)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint *puVar4;
  
  if (nVars < 6) {
    uVar1 = 0;
    uVar3 = (ulong)(uint)nVars;
    if (nVars < 1) {
      uVar3 = uVar1;
    }
    puVar4 = Extra_TruthPolarize::Signs;
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      if (((uint)Polarity >> ((uint)uVar1 & 0x1f) & 1) != 0) {
        bVar2 = (byte)(1 << ((byte)uVar1 & 0x1f));
        uTruth = (*puVar4 & uTruth) >> (bVar2 & 0x1f) | (~*puVar4 & uTruth) << (bVar2 & 0x1f);
      }
      puVar4 = puVar4 + 1;
    }
    return uTruth;
  }
  __assert_fail("nVars < 6",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                ,0x19c,"unsigned int Extra_TruthPolarize(unsigned int, int, int)");
}

Assistant:

unsigned Extra_TruthPolarize( unsigned uTruth, int Polarity, int nVars )
{
    // elementary truth tables
    static unsigned Signs[5] = {
        0xAAAAAAAA,    // 1010 1010 1010 1010 1010 1010 1010 1010
        0xCCCCCCCC,    // 1010 1010 1010 1010 1010 1010 1010 1010
        0xF0F0F0F0,    // 1111 0000 1111 0000 1111 0000 1111 0000
        0xFF00FF00,    // 1111 1111 0000 0000 1111 1111 0000 0000
        0xFFFF0000     // 1111 1111 1111 1111 0000 0000 0000 0000
    };
    unsigned uTruthRes, uCof0, uCof1;
    int nMints, Shift, v;
    assert( nVars < 6 );
    nMints = (1 << nVars);
    uTruthRes = uTruth;
    for ( v = 0; v < nVars; v++ )
        if ( Polarity & (1 << v) )
        {
            uCof0  = uTruth & ~Signs[v];
            uCof1  = uTruth &  Signs[v];
            Shift  = (1 << v);
            uCof0 <<= Shift;
            uCof1 >>= Shift;
            uTruth = uCof0 | uCof1;
        }
    return uTruth;
}